

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<double_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<double_const&> *this,int *rhs)

{
  lest *this_00;
  int *in_R8;
  allocator local_a9;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  string local_88;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  size_type local_38;
  char local_30 [16];
  
  this_00 = *(lest **)this;
  local_48[0] = (double)*rhs == *(double *)this_00;
  std::__cxx11::string::string((string *)&local_a8,"==",&local_a9);
  local_68 = local_58;
  if (local_a8 == local_98) {
    uStack_50 = uStack_90;
  }
  else {
    local_68 = local_a8;
  }
  local_60 = local_a0;
  local_a0 = 0;
  local_98[0] = 0;
  local_a8 = local_98;
  to_string<double,int>(&local_88,this_00,(double *)&local_68,(string *)rhs,in_R8);
  local_40._M_p = local_30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    local_30[8] = local_88.field_2._M_local_buf[8];
    local_30[9] = local_88.field_2._M_local_buf[9];
    local_30[10] = local_88.field_2._M_local_buf[10];
    local_30[0xb] = local_88.field_2._M_local_buf[0xb];
    local_30[0xc] = local_88.field_2._M_local_buf[0xc];
    local_30[0xd] = local_88.field_2._M_local_buf[0xd];
    local_30[0xe] = local_88.field_2._M_local_buf[0xe];
    local_30[0xf] = local_88.field_2._M_local_buf[0xf];
  }
  else {
    local_40._M_p = local_88._M_dataplus._M_p;
  }
  local_38 = local_88._M_string_length;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  result::result(__return_storage_ptr__,(result *)local_48);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }